

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAtomicCounterTests.cpp
# Opt level: O2

vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
* deqp::gles31::Functional::NegativeTestShared::getNegativeAtomicCounterTestFunctions(void)

{
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>>
  *in_RDI;
  FunctionContainer funcs [7];
  allocator_type local_b9;
  FunctionContainer local_b8 [7];
  
  memcpy(local_b8,&PTR_atomic_max_counter_bindings_00a1a020,0xa8);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>>
  ::vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer_const*,void>
            (in_RDI,local_b8,(FunctionContainer *)&stack0xfffffffffffffff0,&local_b9);
  return (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
          *)in_RDI;
}

Assistant:

std::vector<FunctionContainer> getNegativeAtomicCounterTestFunctions ()
{
	const FunctionContainer funcs[] =
	{
		{atomic_max_counter_bindings,		"atomic_max_counter_bindings",		"Invalid atomic counter buffer binding."	},
		{atomic_precision,					"atomic_precision",					"Invalid precision qualifier."				},
		{atomic_binding_offset_overlap,		"atomic_binding_offset_overlap",	"Invalid offset."							},
		{atomic_binding_omitted,			"atomic_binding_omitted",			"Binding not specified."					},
		{atomic_struct,						"atomic_struct",					"Invalid atomic_uint usage in struct."		},
		{atomic_body_write,					"atomic_body_write",				"Invalid write access to atomic_uint."		},
		{atomic_body_declare,				"atomic_body_declare",				"Invalid precision qualifier."				},
	};

	return std::vector<FunctionContainer>(DE_ARRAY_BEGIN(funcs), DE_ARRAY_END(funcs));
}